

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadBGFTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  int iVar1;
  char *__nptr;
  size_type sVar2;
  runtime_error *this_00;
  _func_int **pp_Var3;
  long *in_RDX;
  Node *in_RDI;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  AffineSpace3fa space;
  size_t child;
  char *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_01;
  string *in_stack_fffffffffffffc00;
  _Base_ptr *pp_Var8;
  XML *in_stack_fffffffffffffc08;
  undefined8 in_stack_fffffffffffffc10;
  undefined1 cast;
  Token *in_stack_fffffffffffffc18;
  undefined8 local_3a8;
  ulong uStack_3a0;
  ParseLocation *in_stack_fffffffffffffc68;
  AffineSpace3fa *pAStack_390;
  _Base_ptr local_388;
  ulong uStack_380;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_378;
  TransformNode *this_02;
  _Base_ptr local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined1 local_308 [23];
  undefined1 local_2f1;
  string local_2d0 [55];
  allocator local_299;
  string local_298 [32];
  string local_278 [32];
  long local_258;
  long *local_250;
  long *local_238;
  long *local_230;
  long *local_228;
  long *local_220;
  long *local_218;
  long *local_210;
  long *local_208;
  long *local_200;
  long *local_1f8;
  long *local_1f0;
  long *local_1e8;
  long *local_1e0;
  long *local_1d8;
  long *local_1d0;
  float local_1bc;
  float local_1b8;
  float local_1b4;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_1b0;
  float local_1a4;
  float local_1a0;
  float local_19c;
  _Base_ptr *local_198;
  float local_18c;
  float local_188;
  float local_184;
  undefined1 *local_180;
  float local_174;
  float local_170;
  float local_16c;
  undefined8 *local_168;
  undefined8 *local_160;
  _Base_ptr *local_158;
  undefined1 *local_150;
  undefined8 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  _Base_ptr *local_130;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_128;
  _Base_ptr *local_120;
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *local_118;
  _Base_ptr *local_110;
  _Base_ptr *local_108;
  _Base_ptr *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  _func_int **local_e8;
  undefined8 local_d8;
  ulong uStack_d0;
  float local_c8;
  float local_c4;
  float local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  ulong uStack_b0;
  float local_a8;
  float local_a4;
  float local_a0;
  undefined4 local_9c;
  _Base_ptr local_98;
  ulong uStack_90;
  float local_88;
  float local_84;
  float local_80;
  undefined4 local_7c;
  undefined1 local_78 [20];
  float local_64;
  float local_60;
  undefined4 local_5c;
  _Base_ptr *local_58;
  undefined1 *local_50;
  undefined8 *local_48;
  undefined8 *local_40;
  _Base_ptr *local_38;
  _Base_ptr *local_30;
  _Base_ptr *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  _Base_ptr *local_10;
  undefined8 *local_8;
  
  cast = (undefined1)((ulong)in_stack_fffffffffffffc10 >> 0x38);
  local_250 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"child",&local_299);
  XML::parm(in_stack_fffffffffffffc08,in_stack_fffffffffffffc00);
  __nptr = (char *)std::__cxx11::string::c_str();
  iVar1 = atoi(__nptr);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  local_1d0 = local_250;
  local_258 = (long)iVar1;
  sVar2 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98));
  if (sVar2 != 0xc) {
    local_2f1 = 1;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1d8 = local_250;
    ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffc68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   in_stack_fffffffffffffbc0);
    std::runtime_error::runtime_error(this_00,local_2d0);
    local_2f1 = 0;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1e0 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),0);
  fVar4 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_1e8 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),1);
  fVar5 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_1f0 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),2);
  local_1bc = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  this_01 = &local_378;
  local_5c = 0;
  local_78._4_4_ = fVar5;
  local_78._0_4_ = fVar4;
  local_78._8_8_ = ZEXT48((uint)local_1bc);
  local_1f8 = local_250;
  local_1b8 = fVar5;
  local_1b4 = fVar4;
  local_1b0 = this_01;
  local_78._16_4_ = fVar4;
  local_64 = fVar5;
  local_60 = local_1bc;
  local_378._M_t._M_impl._0_8_ = local_78._0_8_;
  local_378._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_78._8_8_;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),3);
  fVar4 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_200 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),4);
  fVar5 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_208 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),5);
  local_1a4 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_7c = 0;
  local_98 = (_Base_ptr)CONCAT44(fVar5,fVar4);
  uStack_90 = (ulong)(uint)local_1a4;
  local_210 = local_250;
  local_1a0 = fVar5;
  local_19c = fVar4;
  local_198 = &local_388;
  local_88 = fVar4;
  local_84 = fVar5;
  local_80 = local_1a4;
  local_388 = local_98;
  uStack_380 = uStack_90;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),6);
  fVar4 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_218 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),7);
  fVar5 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_220 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),8);
  local_18c = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_180 = &stack0xfffffffffffffc68;
  local_9c = 0;
  local_b8 = CONCAT44(fVar5,fVar4);
  uStack_b0 = (ulong)(uint)local_18c;
  pp_Var8 = &local_378._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_378._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       *(_Base_ptr *)&(this_01->_M_t)._M_impl;
  local_378._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       *(_Base_ptr *)&(this_01->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_100 = &local_378._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  local_378._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_388;
  local_378._M_t._M_impl.super__Rb_tree_header._M_node_count = uStack_380;
  local_f0 = &stack0xfffffffffffffcb8;
  local_228 = local_250;
  local_188 = fVar5;
  local_184 = fVar4;
  local_138 = local_180;
  local_130 = &local_388;
  local_128 = this_01;
  local_120 = pp_Var8;
  local_118 = this_01;
  local_110 = pp_Var8;
  local_108 = &local_388;
  local_f8 = local_180;
  local_a8 = fVar4;
  local_a4 = fVar5;
  local_a0 = local_18c;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),9);
  fVar6 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_230 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),10);
  fVar7 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_238 = local_250;
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*local_250 + 0x98),0xb);
  local_174 = Token::Float(in_stack_fffffffffffffc18,(bool)cast);
  local_168 = &local_3a8;
  local_bc = 0;
  local_d8 = CONCAT44(fVar7,fVar6);
  uStack_d0 = (ulong)(uint)local_174;
  local_150 = &stack0xfffffffffffffcc8;
  local_30 = &local_328;
  local_40 = &local_318;
  this_02 = (TransformNode *)*pp_Var8;
  local_38 = pp_Var8 + 2;
  local_328 = *local_38;
  uStack_320 = pp_Var8[3];
  local_48 = pp_Var8 + 4;
  local_318 = *local_48;
  uStack_310 = pp_Var8[5];
  local_140 = local_308;
  local_170 = fVar7;
  local_16c = fVar6;
  local_160 = local_168;
  local_158 = pp_Var8;
  local_148 = local_168;
  local_c8 = fVar6;
  local_c4 = fVar7;
  local_c0 = local_174;
  local_58 = pp_Var8;
  local_50 = local_150;
  local_28 = pp_Var8;
  local_20 = local_150;
  local_18 = local_150;
  local_10 = local_30;
  local_8 = local_40;
  local_3a8 = local_d8;
  uStack_3a0 = uStack_d0;
  pp_Var3 = (_func_int **)SceneGraph::TransformNode::operator_new(0x3cd314);
  std::
  map<unsigned_long,_embree::Ref<embree::SceneGraph::Node>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  ::at(this_01,(key_type *)CONCAT44(fVar5,fVar4));
  SceneGraph::TransformNode::TransformNode
            (this_02,pAStack_390,(Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffffc68);
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var3;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_e8 = pp_Var3;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadBGFTransformNode(const Ref<XML>& xml) 
  {
    const size_t child = atoi(xml->parm("child").c_str()); 
    if (xml->body.size() != 12) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong AffineSpace body");
    const AffineSpace3fa space(LinearSpace3fa(Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float()),
                                              Vec3fa(xml->body[3].Float(),xml->body[4].Float(),xml->body[5].Float()),
                                              Vec3fa(xml->body[6].Float(),xml->body[7].Float(),xml->body[8].Float())),
                               Vec3fa(xml->body[9].Float(),xml->body[10].Float(),xml->body[11].Float()));
    return new SceneGraph::TransformNode(space,id2node.at(child));
  }